

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O3

void __thiscall
TEST_SimpleStringInternalCache_multipleDifferentSizeAllocationsAndDeallocations_TestShell::
~TEST_SimpleStringInternalCache_multipleDifferentSizeAllocationsAndDeallocations_TestShell
          (TEST_SimpleStringInternalCache_multipleDifferentSizeAllocationsAndDeallocations_TestShell
           *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleStringInternalCache, multipleDifferentSizeAllocationsAndDeallocations)
{
    cache.setAllocator(allocator);

    char* mem10 = cache.alloc(10);
    char* mem11 = cache.alloc(11);

    char* mem100 = cache.alloc(100);
    cache.dealloc(mem100, 100);

    char* mem101 = cache.alloc(101);
    char* mem102 = cache.alloc(102);
    char* mem103 = cache.alloc(103);
    cache.dealloc(mem101, 102);
    cache.dealloc(mem102, 103);
    cache.dealloc(mem103, 104);

    cache.alloc(105);
    cache.alloc(106);
    cache.alloc(107);

    cache.dealloc(mem10, 10);
    cache.dealloc(mem11, 11);

    LONGS_EQUAL(2, accountant.totalAllocationsOfSize(32));
    LONGS_EQUAL(3, accountant.totalAllocationsOfSize(128));
}